

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::duplicateCols(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,bool *again)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar1;
  DataKey *pDVar2;
  int *piVar3;
  Real RVar4;
  type_conflict5 tVar5;
  bool bVar6;
  bool bVar7;
  Result RVar8;
  uint uVar9;
  shared_ptr<soplex::Tolerances> *psVar10;
  ulong uVar11;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *this_00;
  DuplicateColsPS *pDVar12;
  undefined8 extraout_RAX;
  double *pdVar13;
  FixBoundsPS *pFVar14;
  pointer pDVar15;
  SPxOut *pSVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int j;
  long lVar23;
  long lVar24;
  int iVar25;
  cpp_dec_float<200U,_int,_void> *pcVar26;
  uint *puVar27;
  pointer pnVar28;
  int **ppiVar29;
  pointer pnVar30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar31;
  ElementCompare *pEVar32;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar33;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  Item *pIVar34;
  int iVar35;
  int k;
  long lVar36;
  ulong uVar37;
  byte bVar38;
  int remCols;
  long local_1190;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  int *idxMem;
  undefined4 local_10ec;
  IdxSet idxSet;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  scale;
  DataArray<int> pClass;
  DataArray<bool> remCol;
  DataArray<int> classSize;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_fa8;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_f98;
  DataArray<bool> fixAndRemCol;
  DataArray<int> m_perm_empty;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  factor;
  int *perm;
  uint auStack_ed0 [25];
  undefined3 uStack_e6b;
  int iStack_e68;
  bool bStack_e64;
  undefined8 local_e60;
  DataArray<int> da_perm;
  ElementCompare compare;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_d58;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_d48;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_d38;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_d28;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_d18;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_d08;
  DataArray<int> local_cf8;
  DataArray<int> local_ce0;
  DataArray<int> local_cc8;
  cpp_dec_float<200U,_int,_void> local_cb0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_bb0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ab0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_930;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_830;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_730;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_630;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b0;
  cpp_dec_float<200U,_int,_void> local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  cpp_dec_float<200U,_int,_void> local_430;
  cpp_dec_float<200U,_int,_void> local_3b0;
  cpp_dec_float<200U,_int,_void> local_330;
  cpp_dec_float<200U,_int,_void> local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  cpp_dec_float<200U,_int,_void> local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar38 = 0;
  remCols = 0;
  RVar8 = removeEmpty(this,lp);
  if (RVar8 == OKAY) {
    iVar25 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum;
    RVar8 = OKAY;
    if (1 < iVar25) {
      DataArray<int>::DataArray(&pClass,iVar25,0,1.2);
      DataArray<int>::DataArray
                (&classSize,
                 (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum,0,1.2);
      Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Array(&scale,(lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
      idxMem = (int *)0x0;
      spx_alloc<int*>(&idxMem,(lp->
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum);
      idxSet.len = (lp->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
      idxSet._vptr_IdxSet = (_func_int **)&PTR__IdxSet_0053d170;
      idxSet.num = 0;
      idxSet.idx = idxMem;
      idxSet.freeArray = false;
      *pClass.data = 0;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)
                 scale.data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,0.0);
      iVar25 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      *classSize.data = iVar25;
      lVar36 = 0x80;
      for (lVar23 = 1; lVar23 < iVar25; lVar23 = lVar23 + 1) {
        pClass.data[lVar23] = 0;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)
                   ((long)((scale.data.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar36),0.0);
        classSize.data[lVar23] = 0;
        lVar17 = (long)idxSet.num;
        idxSet.num = idxSet.num + 1;
        idxSet.idx[lVar17] = (int)lVar23;
        iVar25 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        lVar36 = lVar36 + 0x80;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_cb0,0.0,(type *)0x0);
      psVar10 = &(this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances;
      lVar23 = 0x1c;
      for (lVar36 = 0;
          lVar36 < (lp->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum; lVar36 = lVar36 + 1) {
        pIVar34 = (lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.theitem +
                  (lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[lVar36].idx;
        lVar17 = 0;
        lVar22 = 0;
        while (uVar11 = (ulong)(pIVar34->data).
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .memused, lVar22 < (long)uVar11) {
          pNVar1 = (pIVar34->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          puVar27 = (uint *)((long)(pNVar1->val).m_backend.data._M_elems + lVar17);
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)&compare;
          for (lVar18 = lVar23; lVar18 != 0; lVar18 = lVar18 + -1) {
            (pcVar26->data)._M_elems[0] = *puVar27;
            puVar27 = puVar27 + (ulong)bVar38 * -2 + 1;
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar38 * -8 + 4);
          }
          compare.epsiloncompare.m_backend.exp =
               *(int *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar17);
          compare.epsiloncompare.m_backend.neg =
               *(bool *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar17 + 4);
          compare.epsiloncompare.m_backend._120_8_ =
               *(undefined8 *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar17 + 8);
          iVar25 = *(int *)((long)(&((pIVar34->data).
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem)->val + 1) + lVar17);
          da_perm.thesize = 0;
          da_perm.themax = 0;
          tVar5 = boost::multiprecision::operator==
                            (scale.data.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + iVar25,(double *)&da_perm);
          if (tVar5) {
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)&compare;
            pnVar28 = scale.data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + iVar25;
            for (lVar18 = lVar23; lVar18 != 0; lVar18 = lVar18 + -1) {
              (pnVar28->m_backend).data._M_elems[0] = (pcVar26->data)._M_elems[0];
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar38 * -8 + 4);
              pnVar28 = (pointer)((long)pnVar28 + ((ulong)bVar38 * -2 + 1) * 4);
            }
            scale.data.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.exp =
                 compare.epsiloncompare.m_backend.exp;
            scale.data.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.neg =
                 compare.epsiloncompare.m_backend.neg;
            scale.data.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.fpclass =
                 compare.epsiloncompare.m_backend.fpclass;
            scale.data.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.prec_elem =
                 compare.epsiloncompare.m_backend.prec_elem;
          }
          iVar35 = pClass.data[iVar25];
          pDVar15 = (this->m_classSetCols).data.
                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          da_perm.thesize = 0;
          da_perm.themax = 0;
          da_perm.data = (int *)0x0;
          da_perm.memFactor = 0.0;
          local_1190 = lVar22;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)&da_perm,
                     (cpp_dec_float<200U,_int,_void> *)&compare,
                     &scale.data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend);
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add(pDVar15 + iVar35,iVar25,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&da_perm);
          piVar3 = classSize.data + pClass.data[iVar25];
          *piVar3 = *piVar3 + -1;
          if (*piVar3 == 0) {
            lVar22 = (long)idxSet.num;
            idxSet.num = idxSet.num + 1;
            idxSet.idx[lVar22] = pClass.data[iVar25];
          }
          lVar17 = lVar17 + 0x84;
          lVar22 = local_1190 + 1;
        }
        for (lVar17 = 0; lVar17 < (int)uVar11; lVar17 = lVar17 + 1) {
          iVar25 = pClass.data
                   [(pIVar34->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem[lVar17].idx];
          if (0 < (this->m_classSetCols).data.
                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar25].
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused) {
            std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&da_perm,
                       &psVar10->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)
            ;
            RVar4 = Tolerances::epsilon((Tolerances *)da_perm._0_8_);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (&local_b0,RVar4,(type *)0x0);
            ElementCompare::ElementCompare
                      (&compare,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_b0);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&da_perm.data);
            pDVar15 = (this->m_classSetCols).data.
                      super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            iVar35 = pDVar15[iVar25].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
            if (1 < iVar35) {
              SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
                        (pDVar15[iVar25].
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .m_elem,iVar35,&compare,0,true);
              pDVar15 = (this->m_classSetCols).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            iVar35 = *idxSet.idx;
            lVar22 = (long)idxSet.num;
            idxSet.num = idxSet.num + -1;
            *idxSet.idx = idxSet.idx[lVar22 + -1];
            lVar18 = 0;
            lVar22 = 0;
            while( true ) {
              if (pDVar15[iVar25].
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused <= lVar22) break;
              if (lVar18 != 0) {
                local_1190 = CONCAT44(local_1190._4_4_,iVar35);
                pNVar1 = pDVar15[iVar25].
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .m_elem;
                puVar27 = (uint *)((long)(pNVar1->val).m_backend.data._M_elems + lVar18);
                pnVar31 = &local_5b0;
                for (lVar19 = lVar23; lVar19 != 0; lVar19 = lVar19 + -1) {
                  (pnVar31->m_backend).data._M_elems[0] = *puVar27;
                  puVar27 = puVar27 + (ulong)bVar38 * -2 + 1;
                  pnVar31 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar31 + ((ulong)bVar38 * -2 + 1) * 4);
                }
                local_5b0.m_backend.exp =
                     *(int *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar18);
                local_5b0.m_backend.neg =
                     *(bool *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar18 + 4U);
                local_5b0.m_backend._120_8_ =
                     *(undefined8 *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar18 + 8U);
                pcVar26 = &local_cb0;
                pnVar31 = &local_630;
                for (lVar19 = lVar23; lVar19 != 0; lVar19 = lVar19 + -1) {
                  (pnVar31->m_backend).data._M_elems[0] = (pcVar26->data)._M_elems[0];
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar26 + ((ulong)bVar38 * -2 + 1) * 4);
                  pnVar31 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar31 + ((ulong)bVar38 * -2 + 1) * 4);
                }
                local_630.m_backend.exp = local_cb0.exp;
                local_630.m_backend.neg = local_cb0.neg;
                local_630.m_backend.fpclass = local_cb0.fpclass;
                local_630.m_backend.prec_elem = local_cb0.prec_elem;
                epsZero(&local_130,this);
                bVar6 = NErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (&local_5b0,&local_630,&local_130);
                iVar35 = (int)local_1190;
                if (bVar6) {
                  iVar35 = *idxSet.idx;
                  lVar19 = (long)idxSet.num;
                  idxSet.num = idxSet.num + -1;
                  *idxSet.idx = idxSet.idx[lVar19 + -1];
                }
              }
              pDVar15 = (this->m_classSetCols).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pNVar1 = pDVar15[iVar25].
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              pClass.data[*(int *)((long)(&pNVar1->val + 1) + lVar18)] = iVar35;
              classSize.data[iVar35] = classSize.data[iVar35] + 1;
              puVar27 = (uint *)((long)(pNVar1->val).m_backend.data._M_elems + lVar18);
              pcVar26 = &local_cb0;
              for (lVar19 = lVar23; lVar19 != 0; lVar19 = lVar19 + -1) {
                (pcVar26->data)._M_elems[0] = *puVar27;
                puVar27 = puVar27 + (ulong)bVar38 * -2 + 1;
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar26 + ((ulong)bVar38 * -2 + 1) * 4);
              }
              local_cb0.exp = *(int *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar18);
              local_cb0.neg = *(bool *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar18 + 4U);
              local_cb0._120_8_ =
                   *(undefined8 *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar18 + 8U);
              lVar22 = lVar22 + 1;
              lVar18 = lVar18 + 0x84;
            }
            pDVar15[iVar25].
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused = 0;
            uVar11 = (ulong)(uint)(pIVar34->data).
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .memused;
          }
        }
      }
      free(idxMem);
      idxMem = (int *)0x0;
      DataArray<bool>::DataArray
                (&remCol,(lp->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.thenum,0,1.2);
      lVar23 = 0;
      DataArray<bool>::DataArray
                (&fixAndRemCol,
                 (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum,0,1.2);
      uVar9 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum;
      pDVar15 = (this->m_dupCols).data.
                super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = 0;
      if (0 < (int)uVar9) {
        uVar11 = (ulong)uVar9;
      }
      for (; uVar11 * 0x20 != lVar23; lVar23 = lVar23 + 0x20) {
        *(undefined4 *)
         ((long)&(pDVar15->
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).memused + lVar23) = 0;
      }
      for (lVar23 = 0; lVar23 < (int)uVar9; lVar23 = lVar23 + 1) {
        remCol.data[lVar23] = false;
        fixAndRemCol.data[lVar23] = false;
        iVar25 = pClass.data[lVar23];
        pDVar15 = (this->m_dupCols).data.
                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)&compare,0.0,(type *)0x0);
        DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(pDVar15 + iVar25,(int)lVar23,
              (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&compare);
        uVar9 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum;
      }
      DataArray<int>::DataArray(&m_perm_empty,0,0,1.2);
      this_00 = &this->m_hist;
      bVar6 = false;
      for (lVar23 = 0;
          lVar36 = (long)(lp->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.thenum, lVar23 < lVar36; lVar23 = lVar23 + 1) {
        pDVar15 = (this->m_dupCols).data.
                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((1 < pDVar15[lVar23].
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused) &&
           ((lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem
            [(lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey
             [(pDVar15[lVar23].
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem)->idx].idx].data.
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused != 1)) {
          if (!bVar6) {
            pDVar12 = (DuplicateColsPS *)operator_new(0x2d0);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (&local_1b0,1.0,(type *)0x0);
            DataArray<int>::DataArray(&local_cc8,&m_perm_empty);
            std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_d08,
                       &psVar10->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)
            ;
            DuplicateColsPS::DuplicateColsPS
                      (pDVar12,lp,0,0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_1b0,&local_cc8,(shared_ptr<soplex::Tolerances> *)&local_d08,true,
                       false);
            std::
            __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
            ::
            __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS,void>
                      ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                        *)&compare,pDVar12);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d08._M_refcount)
            ;
            DataArray<int>::~DataArray(&local_cc8);
            std::
            vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
            ::push_back(&this_00->data,(value_type *)&compare);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       (compare.epsiloncompare.m_backend.data._M_elems + 2));
            pDVar15 = (this->m_dupCols).data.
                      super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            bVar6 = true;
          }
          local_1190 = 0;
          for (lVar17 = 0;
              lVar17 < pDVar15[lVar23].
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused; lVar17 = lVar17 + 1) {
            lVar18 = 0;
            for (lVar22 = 0;
                lVar22 < pDVar15[lVar23].
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused; lVar22 = lVar22 + 1) {
              if (local_1190 != lVar18) {
                pNVar1 = pDVar15[lVar23].
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .m_elem;
                iVar25 = pNVar1[lVar17].idx;
                lVar19 = (long)iVar25;
                if (remCol.data[lVar19] == false) {
                  iVar35 = *(int *)((long)(&pNVar1->val + 1) + lVar18);
                  lVar24 = (long)iVar35;
                  if (remCol.data[lVar24] == false) {
                    pnVar28 = (lp->
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).object.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    lVar21 = 0x1c;
                    pnVar30 = pnVar28 + lVar19;
                    pEVar32 = &compare;
                    for (lVar20 = lVar21; lVar20 != 0; lVar20 = lVar20 + -1) {
                      (pEVar32->epsiloncompare).m_backend.data._M_elems[0] =
                           (pnVar30->m_backend).data._M_elems[0];
                      pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
                      pEVar32 = (ElementCompare *)((long)pEVar32 + ((ulong)bVar38 * -2 + 1) * 4);
                    }
                    compare.epsiloncompare.m_backend.exp = pnVar28[lVar19].m_backend.exp;
                    compare.epsiloncompare.m_backend.neg = pnVar28[lVar19].m_backend.neg;
                    compare.epsiloncompare.m_backend.fpclass = pnVar28[lVar19].m_backend.fpclass;
                    compare.epsiloncompare.m_backend.prec_elem = pnVar28[lVar19].m_backend.prec_elem
                    ;
                    pnVar28 = pnVar28 + lVar24;
                    pcVar26 = (cpp_dec_float<200U,_int,_void> *)&da_perm;
                    for (; lVar21 != 0; lVar21 = lVar21 + -1) {
                      (pcVar26->data)._M_elems[0] = (pnVar28->m_backend).data._M_elems[0];
                      pnVar28 = (pointer)((long)pnVar28 + ((ulong)bVar38 * -2 + 1) * 4);
                      pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar26 + (ulong)bVar38 * -8 + 4);
                    }
                    factor.m_backend.fpclass = cpp_dec_float_finite;
                    factor.m_backend.prec_elem = 0x1c;
                    factor.m_backend.data._M_elems[0] = 0;
                    factor.m_backend.data._M_elems[1] = 0;
                    factor.m_backend.data._M_elems[2] = 0;
                    factor.m_backend.data._M_elems[3] = 0;
                    factor.m_backend.data._M_elems[4] = 0;
                    factor.m_backend.data._M_elems[5] = 0;
                    factor.m_backend.data._M_elems[6] = 0;
                    factor.m_backend.data._M_elems[7] = 0;
                    factor.m_backend.data._M_elems[8] = 0;
                    factor.m_backend.data._M_elems[9] = 0;
                    factor.m_backend.data._M_elems[10] = 0;
                    factor.m_backend.data._M_elems[0xb] = 0;
                    factor.m_backend.data._M_elems[0xc] = 0;
                    factor.m_backend.data._M_elems[0xd] = 0;
                    factor.m_backend.data._M_elems[0xe] = 0;
                    factor.m_backend.data._M_elems[0xf] = 0;
                    factor.m_backend.data._M_elems[0x10] = 0;
                    factor.m_backend.data._M_elems[0x11] = 0;
                    factor.m_backend.data._M_elems[0x12] = 0;
                    factor.m_backend.data._M_elems[0x13] = 0;
                    factor.m_backend.data._M_elems[0x14] = 0;
                    factor.m_backend.data._M_elems[0x15] = 0;
                    factor.m_backend.data._M_elems[0x16] = 0;
                    factor.m_backend.data._M_elems[0x17] = 0;
                    factor.m_backend.data._M_elems[0x18] = 0;
                    factor.m_backend.data._M_elems[0x19] = 0;
                    factor.m_backend.data._M_elems._104_5_ = 0;
                    factor.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                    factor.m_backend.exp = 0;
                    factor.m_backend.neg = false;
                    boost::multiprecision::default_ops::
                    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                              (&factor.m_backend,
                               &scale.data.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar19].m_backend,
                               &scale.data.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar24].m_backend);
                    result_1.m_backend.fpclass = cpp_dec_float_finite;
                    result_1.m_backend.prec_elem = 0x1c;
                    result_1.m_backend.data._M_elems[0] = 0;
                    result_1.m_backend.data._M_elems[1] = 0;
                    result_1.m_backend.data._M_elems[2] = 0;
                    result_1.m_backend.data._M_elems[3] = 0;
                    result_1.m_backend.data._M_elems[4] = 0;
                    result_1.m_backend.data._M_elems[5] = 0;
                    result_1.m_backend.data._M_elems[6] = 0;
                    result_1.m_backend.data._M_elems[7] = 0;
                    result_1.m_backend.data._M_elems[8] = 0;
                    result_1.m_backend.data._M_elems[9] = 0;
                    result_1.m_backend.data._M_elems[10] = 0;
                    result_1.m_backend.data._M_elems[0xb] = 0;
                    result_1.m_backend.data._M_elems[0xc] = 0;
                    result_1.m_backend.data._M_elems[0xd] = 0;
                    result_1.m_backend.data._M_elems[0xe] = 0;
                    result_1.m_backend.data._M_elems[0xf] = 0;
                    result_1.m_backend.data._M_elems[0x10] = 0;
                    result_1.m_backend.data._M_elems[0x11] = 0;
                    result_1.m_backend.data._M_elems[0x12] = 0;
                    result_1.m_backend.data._M_elems[0x13] = 0;
                    result_1.m_backend.data._M_elems[0x14] = 0;
                    result_1.m_backend.data._M_elems[0x15] = 0;
                    result_1.m_backend.data._M_elems[0x16] = 0;
                    result_1.m_backend.data._M_elems[0x17] = 0;
                    result_1.m_backend.data._M_elems[0x18] = 0;
                    result_1.m_backend.data._M_elems[0x19] = 0;
                    result_1.m_backend.data._M_elems._104_5_ = 0;
                    result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                    result_1.m_backend.exp = 0;
                    result_1.m_backend.neg = false;
                    boost::multiprecision::default_ops::
                    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                              (&result_1.m_backend,(cpp_dec_float<200U,_int,_void> *)&da_perm,
                               &scale.data.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar19].m_backend);
                    result_2.m_backend.fpclass = cpp_dec_float_finite;
                    result_2.m_backend.prec_elem = 0x1c;
                    result_2.m_backend.data._M_elems[0] = 0;
                    result_2.m_backend.data._M_elems[1] = 0;
                    result_2.m_backend.data._M_elems[2] = 0;
                    result_2.m_backend.data._M_elems[3] = 0;
                    result_2.m_backend.data._M_elems[4] = 0;
                    result_2.m_backend.data._M_elems[5] = 0;
                    result_2.m_backend.data._M_elems[6] = 0;
                    result_2.m_backend.data._M_elems[7] = 0;
                    result_2.m_backend.data._M_elems[8] = 0;
                    result_2.m_backend.data._M_elems[9] = 0;
                    result_2.m_backend.data._M_elems[10] = 0;
                    result_2.m_backend.data._M_elems[0xb] = 0;
                    result_2.m_backend.data._M_elems[0xc] = 0;
                    result_2.m_backend.data._M_elems[0xd] = 0;
                    result_2.m_backend.data._M_elems[0xe] = 0;
                    result_2.m_backend.data._M_elems[0xf] = 0;
                    result_2.m_backend.data._M_elems[0x10] = 0;
                    result_2.m_backend.data._M_elems[0x11] = 0;
                    result_2.m_backend.data._M_elems[0x12] = 0;
                    result_2.m_backend.data._M_elems[0x13] = 0;
                    result_2.m_backend.data._M_elems[0x14] = 0;
                    result_2.m_backend.data._M_elems[0x15] = 0;
                    result_2.m_backend.data._M_elems[0x16] = 0;
                    result_2.m_backend.data._M_elems[0x17] = 0;
                    result_2.m_backend.data._M_elems[0x18] = 0;
                    result_2.m_backend.data._M_elems[0x19] = 0;
                    result_2.m_backend.data._M_elems._104_5_ = 0;
                    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                    result_2.m_backend.exp = 0;
                    result_2.m_backend.neg = false;
                    boost::multiprecision::default_ops::
                    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                              (&result_2.m_backend,&result_1.m_backend,
                               &scale.data.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar24].m_backend);
                    local_e60._0_4_ = cpp_dec_float_finite;
                    local_e60._4_4_ = 0x1c;
                    perm = (int *)0x0;
                    auStack_ed0[0] = 0;
                    auStack_ed0[1] = 0;
                    auStack_ed0[2] = 0;
                    auStack_ed0[3] = 0;
                    auStack_ed0[4] = 0;
                    auStack_ed0[5] = 0;
                    auStack_ed0[6] = 0;
                    auStack_ed0[7] = 0;
                    auStack_ed0[8] = 0;
                    auStack_ed0[9] = 0;
                    auStack_ed0[10] = 0;
                    auStack_ed0[0xb] = 0;
                    auStack_ed0[0xc] = 0;
                    auStack_ed0[0xd] = 0;
                    auStack_ed0[0xe] = 0;
                    auStack_ed0[0xf] = 0;
                    auStack_ed0[0x10] = 0;
                    auStack_ed0[0x11] = 0;
                    auStack_ed0[0x12] = 0;
                    auStack_ed0[0x13] = 0;
                    auStack_ed0[0x14] = 0;
                    auStack_ed0[0x15] = 0;
                    auStack_ed0[0x16] = 0;
                    auStack_ed0[0x17] = 0;
                    stack0xfffffffffffff190 = 0;
                    uStack_e6b = 0;
                    iStack_e68 = 0;
                    bStack_e64 = false;
                    boost::multiprecision::default_ops::
                    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                              ((cpp_dec_float<200U,_int,_void> *)&perm,
                               (cpp_dec_float<200U,_int,_void> *)&compare,&result_2.m_backend);
                    ppiVar29 = &perm;
                    pnVar31 = &local_730;
                    for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                      (pnVar31->m_backend).data._M_elems[0] = *(uint *)ppiVar29;
                      ppiVar29 = (int **)((long)ppiVar29 + (ulong)bVar38 * -8 + 4);
                      pnVar31 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar31 + ((ulong)bVar38 * -2 + 1) * 4);
                    }
                    local_730.m_backend.exp = iStack_e68;
                    local_730.m_backend.neg = bStack_e64;
                    local_730.m_backend.fpclass = (fpclass_type)local_e60;
                    local_730.m_backend.prec_elem = local_e60._4_4_;
                    epsZero(&local_230,this);
                    bVar7 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (&local_730,&local_230);
                    pnVar28 = (lp->
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).low.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if (bVar7) {
                      pnVar30 = pnVar28 + lVar19;
                      pnVar31 = &local_7b0;
                      for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                        (pnVar31->m_backend).data._M_elems[0] =
                             (pnVar30->m_backend).data._M_elems[0];
                        pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
                        pnVar31 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)((long)pnVar31 + ((ulong)bVar38 * -2 + 1) * 4);
                      }
                      local_7b0.m_backend.exp = pnVar28[lVar19].m_backend.exp;
                      local_7b0.m_backend.neg = pnVar28[lVar19].m_backend.neg;
                      local_7b0.m_backend.fpclass = pnVar28[lVar19].m_backend.fpclass;
                      local_7b0.m_backend.prec_elem = pnVar28[lVar19].m_backend.prec_elem;
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                      cpp_dec_float<double>(&local_2b0,0.0,(type *)0x0);
                      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                      __shared_ptr((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)
                                   &result_2,
                                   &psVar10->
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  );
                      RVar4 = Tolerances::epsilon((Tolerances *)
                                                  result_2.m_backend.data._M_elems._0_8_);
                      bVar7 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                        (&local_7b0,
                                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_2b0,RVar4);
                      if (bVar7) {
                        pnVar28 = (lp->
                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).up.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        pnVar30 = pnVar28 + lVar19;
                        pnVar31 = &local_830;
                        for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                          (pnVar31->m_backend).data._M_elems[0] =
                               (pnVar30->m_backend).data._M_elems[0];
                          pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
                          pnVar31 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)((long)pnVar31 + ((ulong)bVar38 * -2 + 1) * 4);
                        }
                        local_830.m_backend.exp = pnVar28[lVar19].m_backend.exp;
                        local_830.m_backend.neg = pnVar28[lVar19].m_backend.neg;
                        local_830.m_backend.fpclass = pnVar28[lVar19].m_backend.fpclass;
                        local_830.m_backend.prec_elem = pnVar28[lVar19].m_backend.prec_elem;
                        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                        cpp_dec_float<double>(&local_330,0.0,(type *)0x0);
                        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                        __shared_ptr((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *
                                     )&result_1.m_backend,
                                     &psVar10->
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    );
                        RVar4 = Tolerances::epsilon((Tolerances *)
                                                    result_1.m_backend.data._M_elems._0_8_);
                        bVar7 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                          (&local_830,
                                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&local_330,RVar4);
                        if (!bVar7) {
LAB_004104cd:
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                     (result_1.m_backend.data._M_elems + 2));
                          goto LAB_004104da;
                        }
                        pnVar28 = (lp->
                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).low.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        pnVar30 = pnVar28 + lVar24;
                        pnVar31 = &local_8b0;
                        for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                          (pnVar31->m_backend).data._M_elems[0] =
                               (pnVar30->m_backend).data._M_elems[0];
                          pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
                          pnVar31 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)((long)pnVar31 + ((ulong)bVar38 * -2 + 1) * 4);
                        }
                        local_8b0.m_backend.exp = pnVar28[lVar24].m_backend.exp;
                        local_8b0.m_backend.neg = pnVar28[lVar24].m_backend.neg;
                        local_8b0.m_backend.fpclass = pnVar28[lVar24].m_backend.fpclass;
                        local_8b0.m_backend.prec_elem = pnVar28[lVar24].m_backend.prec_elem;
                        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                        cpp_dec_float<double>(&local_3b0,0.0,(type *)0x0);
                        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                        __shared_ptr((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *
                                     )&ptr_1,&psVar10->
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    );
                        RVar4 = Tolerances::epsilon((Tolerances *)
                                                    ptr_1.
                                                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr);
                        bVar7 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                          (&local_8b0,
                                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&local_3b0,RVar4);
                        if (!bVar7) {
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    (&ptr_1.
                                      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                          goto LAB_004104cd;
                        }
                        pnVar28 = (lp->
                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).up.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        pnVar30 = pnVar28 + lVar24;
                        pnVar31 = &local_930;
                        for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                          (pnVar31->m_backend).data._M_elems[0] =
                               (pnVar30->m_backend).data._M_elems[0];
                          pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
                          pnVar31 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)((long)pnVar31 + ((ulong)bVar38 * -2 + 1) * 4);
                        }
                        local_930.m_backend.exp = pnVar28[lVar24].m_backend.exp;
                        local_930.m_backend.neg = pnVar28[lVar24].m_backend.neg;
                        local_930.m_backend.fpclass = pnVar28[lVar24].m_backend.fpclass;
                        local_930.m_backend.prec_elem = pnVar28[lVar24].m_backend.prec_elem;
                        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                        cpp_dec_float<double>(&local_430,0.0,(type *)0x0);
                        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                        __shared_ptr(&local_f98,
                                     &psVar10->
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    );
                        RVar4 = Tolerances::epsilon(local_f98._M_ptr);
                        bVar7 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                          (&local_930,
                                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&local_430,RVar4);
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  (&local_f98._M_refcount);
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  (&ptr_1.
                                    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                   (result_1.m_backend.data._M_elems + 2));
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                   (result_2.m_backend.data._M_elems + 2));
                        if (!bVar7) goto LAB_004104e4;
                        pDVar12 = (DuplicateColsPS *)operator_new(0x2d0);
                        pnVar31 = &factor;
                        pnVar33 = &local_6b0;
                        for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
                          (pnVar33->m_backend).data._M_elems[0] =
                               (pnVar31->m_backend).data._M_elems[0];
                          pnVar31 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)((long)pnVar31 + ((ulong)bVar38 * -2 + 1) * 4);
                          pnVar33 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)((long)pnVar33 + ((ulong)bVar38 * -2 + 1) * 4);
                        }
                        local_6b0.m_backend.exp = factor.m_backend.exp;
                        local_6b0.m_backend.neg = factor.m_backend.neg;
                        local_6b0.m_backend.fpclass = factor.m_backend.fpclass;
                        local_6b0.m_backend.prec_elem = factor.m_backend.prec_elem;
                        DataArray<int>::DataArray(&local_ce0,&m_perm_empty);
                        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                        __shared_ptr(&local_fa8,
                                     &psVar10->
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    );
                        local_10ec = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                        DuplicateColsPS::DuplicateColsPS
                                  (pDVar12,lp,iVar25,iVar35,&local_6b0,&local_ce0,
                                   (shared_ptr<soplex::Tolerances> *)&local_fa8,false,false);
                        local_10ec = 0;
                        std::
                        __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                        ::
                        __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS,void>
                                  ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                                    *)&ptr_1,pDVar12);
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  (&local_fa8._M_refcount);
                        DataArray<int>::~DataArray(&local_ce0);
                        std::
                        vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                        ::push_back(&this_00->data,(value_type *)&ptr_1);
                        result_2.m_backend.data._M_elems._0_8_ =
                             result_2.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
                        tVar5 = boost::multiprecision::operator>(&factor,(int *)&result_2);
                        if (tVar5) {
                          pnVar28 = (lp->
                                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).low.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pdVar13 = (double *)infinity();
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          cpp_dec_float<double>(&result_2.m_backend,-*pdVar13,(type *)0x0);
                          tVar5 = boost::multiprecision::operator<=
                                            (pnVar28 + lVar24,
                                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)&result_2.m_backend);
                          if (tVar5) {
LAB_0040fdd7:
                            pdVar13 = (double *)infinity();
                            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                            cpp_dec_float<double>(&result_2.m_backend,-*pdVar13,(type *)0x0);
                            (*(lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._vptr_ClassArray[0x2a])(lp,lVar24,&result_2.m_backend,0);
                          }
                          else {
                            pnVar28 = (lp->
                                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).low.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                            pdVar13 = (double *)infinity();
                            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                            cpp_dec_float<double>(&result_1.m_backend,-*pdVar13,(type *)0x0);
                            tVar5 = boost::multiprecision::operator<=
                                              (pnVar28 + lVar19,
                                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)&result_1.m_backend);
                            if (tVar5) goto LAB_0040fdd7;
                            pnVar28 = (lp->
                                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).low.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                            result_1.m_backend.fpclass = cpp_dec_float_finite;
                            result_1.m_backend.prec_elem = 0x1c;
                            result_1.m_backend.data._M_elems[0] = 0;
                            result_1.m_backend.data._M_elems[1] = 0;
                            result_1.m_backend.data._M_elems[2] = 0;
                            result_1.m_backend.data._M_elems[3] = 0;
                            result_1.m_backend.data._M_elems[4] = 0;
                            result_1.m_backend.data._M_elems[5] = 0;
                            result_1.m_backend.data._M_elems[6] = 0;
                            result_1.m_backend.data._M_elems[7] = 0;
                            result_1.m_backend.data._M_elems[8] = 0;
                            result_1.m_backend.data._M_elems[9] = 0;
                            result_1.m_backend.data._M_elems[10] = 0;
                            result_1.m_backend.data._M_elems[0xb] = 0;
                            result_1.m_backend.data._M_elems[0xc] = 0;
                            result_1.m_backend.data._M_elems[0xd] = 0;
                            result_1.m_backend.data._M_elems[0xe] = 0;
                            result_1.m_backend.data._M_elems[0xf] = 0;
                            result_1.m_backend.data._M_elems[0x10] = 0;
                            result_1.m_backend.data._M_elems[0x11] = 0;
                            result_1.m_backend.data._M_elems[0x12] = 0;
                            result_1.m_backend.data._M_elems[0x13] = 0;
                            result_1.m_backend.data._M_elems[0x14] = 0;
                            result_1.m_backend.data._M_elems[0x15] = 0;
                            result_1.m_backend.data._M_elems[0x16] = 0;
                            result_1.m_backend.data._M_elems[0x17] = 0;
                            result_1.m_backend.data._M_elems[0x18] = 0;
                            result_1.m_backend.data._M_elems[0x19] = 0;
                            result_1.m_backend.data._M_elems._104_5_ = 0;
                            result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                            result_1.m_backend.exp = 0;
                            result_1.m_backend.neg = false;
                            boost::multiprecision::default_ops::
                            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                      (&result_1.m_backend,&factor.m_backend,
                                       &pnVar28[lVar19].m_backend);
                            result_2.m_backend.fpclass = cpp_dec_float_finite;
                            result_2.m_backend.prec_elem = 0x1c;
                            result_2.m_backend.data._M_elems[0] = 0;
                            result_2.m_backend.data._M_elems[1] = 0;
                            result_2.m_backend.data._M_elems[2] = 0;
                            result_2.m_backend.data._M_elems[3] = 0;
                            result_2.m_backend.data._M_elems[4] = 0;
                            result_2.m_backend.data._M_elems[5] = 0;
                            result_2.m_backend.data._M_elems[6] = 0;
                            result_2.m_backend.data._M_elems[7] = 0;
                            result_2.m_backend.data._M_elems[8] = 0;
                            result_2.m_backend.data._M_elems[9] = 0;
                            result_2.m_backend.data._M_elems[10] = 0;
                            result_2.m_backend.data._M_elems[0xb] = 0;
                            result_2.m_backend.data._M_elems[0xc] = 0;
                            result_2.m_backend.data._M_elems[0xd] = 0;
                            result_2.m_backend.data._M_elems[0xe] = 0;
                            result_2.m_backend.data._M_elems[0xf] = 0;
                            result_2.m_backend.data._M_elems[0x10] = 0;
                            result_2.m_backend.data._M_elems[0x11] = 0;
                            result_2.m_backend.data._M_elems[0x12] = 0;
                            result_2.m_backend.data._M_elems[0x13] = 0;
                            result_2.m_backend.data._M_elems[0x14] = 0;
                            result_2.m_backend.data._M_elems[0x15] = 0;
                            result_2.m_backend.data._M_elems[0x16] = 0;
                            result_2.m_backend.data._M_elems[0x17] = 0;
                            result_2.m_backend.data._M_elems[0x18] = 0;
                            result_2.m_backend.data._M_elems[0x19] = 0;
                            result_2.m_backend.data._M_elems._104_5_ = 0;
                            result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                            result_2.m_backend.exp = 0;
                            result_2.m_backend.neg = false;
                            boost::multiprecision::default_ops::
                            eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                      (&result_2.m_backend,&pnVar28[lVar24].m_backend,
                                       &result_1.m_backend);
                            (*(lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._vptr_ClassArray[0x2a])(lp,lVar24,&result_2,0);
                          }
                          pnVar28 = (lp->
                                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).up.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pdVar13 = (double *)infinity();
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          cpp_dec_float<double>(&result_2.m_backend,*pdVar13,(type *)0x0);
                          tVar5 = boost::multiprecision::operator>=
                                            (pnVar28 + lVar24,
                                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)&result_2.m_backend);
                          if (!tVar5) {
                            pnVar28 = (lp->
                                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).up.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                            pdVar13 = (double *)infinity();
                            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                            cpp_dec_float<double>(&result_1.m_backend,*pdVar13,(type *)0x0);
                            tVar5 = boost::multiprecision::operator>=
                                              (pnVar28 + lVar19,
                                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)&result_1.m_backend);
                            if (!tVar5) {
                              pnVar28 = (lp->
                                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).up.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                              result_1.m_backend.fpclass = cpp_dec_float_finite;
                              result_1.m_backend.prec_elem = 0x1c;
                              result_1.m_backend.data._M_elems[0] = 0;
                              result_1.m_backend.data._M_elems[1] = 0;
                              result_1.m_backend.data._M_elems[2] = 0;
                              result_1.m_backend.data._M_elems[3] = 0;
                              result_1.m_backend.data._M_elems[4] = 0;
                              result_1.m_backend.data._M_elems[5] = 0;
                              result_1.m_backend.data._M_elems[6] = 0;
                              result_1.m_backend.data._M_elems[7] = 0;
                              result_1.m_backend.data._M_elems[8] = 0;
                              result_1.m_backend.data._M_elems[9] = 0;
                              result_1.m_backend.data._M_elems[10] = 0;
                              result_1.m_backend.data._M_elems[0xb] = 0;
                              result_1.m_backend.data._M_elems[0xc] = 0;
                              result_1.m_backend.data._M_elems[0xd] = 0;
                              result_1.m_backend.data._M_elems[0xe] = 0;
                              result_1.m_backend.data._M_elems[0xf] = 0;
                              result_1.m_backend.data._M_elems[0x10] = 0;
                              result_1.m_backend.data._M_elems[0x11] = 0;
                              result_1.m_backend.data._M_elems[0x12] = 0;
                              result_1.m_backend.data._M_elems[0x13] = 0;
                              result_1.m_backend.data._M_elems[0x14] = 0;
                              result_1.m_backend.data._M_elems[0x15] = 0;
                              result_1.m_backend.data._M_elems[0x16] = 0;
                              result_1.m_backend.data._M_elems[0x17] = 0;
                              result_1.m_backend.data._M_elems[0x18] = 0;
                              result_1.m_backend.data._M_elems[0x19] = 0;
                              result_1.m_backend.data._M_elems._104_5_ = 0;
                              result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                              result_1.m_backend.exp = 0;
                              result_1.m_backend.neg = false;
                              boost::multiprecision::default_ops::
                              eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                        (&result_1.m_backend,&factor.m_backend,
                                         &pnVar28[lVar19].m_backend);
                              result_2.m_backend.fpclass = cpp_dec_float_finite;
                              result_2.m_backend.prec_elem = 0x1c;
                              result_2.m_backend.data._M_elems[0] = 0;
                              result_2.m_backend.data._M_elems[1] = 0;
                              result_2.m_backend.data._M_elems[2] = 0;
                              result_2.m_backend.data._M_elems[3] = 0;
                              result_2.m_backend.data._M_elems[4] = 0;
                              result_2.m_backend.data._M_elems[5] = 0;
                              result_2.m_backend.data._M_elems[6] = 0;
                              result_2.m_backend.data._M_elems[7] = 0;
                              result_2.m_backend.data._M_elems[8] = 0;
                              result_2.m_backend.data._M_elems[9] = 0;
                              result_2.m_backend.data._M_elems[10] = 0;
                              result_2.m_backend.data._M_elems[0xb] = 0;
                              result_2.m_backend.data._M_elems[0xc] = 0;
                              result_2.m_backend.data._M_elems[0xd] = 0;
                              result_2.m_backend.data._M_elems[0xe] = 0;
                              result_2.m_backend.data._M_elems[0xf] = 0;
                              result_2.m_backend.data._M_elems[0x10] = 0;
                              result_2.m_backend.data._M_elems[0x11] = 0;
                              result_2.m_backend.data._M_elems[0x12] = 0;
                              result_2.m_backend.data._M_elems[0x13] = 0;
                              result_2.m_backend.data._M_elems[0x14] = 0;
                              result_2.m_backend.data._M_elems[0x15] = 0;
                              result_2.m_backend.data._M_elems[0x16] = 0;
                              result_2.m_backend.data._M_elems[0x17] = 0;
                              result_2.m_backend.data._M_elems[0x18] = 0;
                              result_2.m_backend.data._M_elems[0x19] = 0;
                              result_2.m_backend.data._M_elems._104_5_ = 0;
                              result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                              result_2.m_backend.exp = 0;
                              result_2.m_backend.neg = false;
                              boost::multiprecision::default_ops::
                              eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                        (&result_2.m_backend,&pnVar28[lVar24].m_backend,
                                         &result_1.m_backend);
                              (*(lp->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._vptr_ClassArray[0x2d])(lp,lVar24,&result_2,0);
                              goto LAB_00410afb;
                            }
                          }
                          pdVar13 = (double *)infinity();
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          cpp_dec_float<double>(&result_2.m_backend,*pdVar13,(type *)0x0);
                          (*(lp->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .
                            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._vptr_ClassArray[0x2d])(lp,lVar24,&result_2.m_backend,0);
                        }
                        else {
                          result_2.m_backend.data._M_elems._0_8_ =
                               result_2.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
                          tVar5 = boost::multiprecision::operator<(&factor,(int *)&result_2);
                          if (tVar5) {
                            pnVar28 = (lp->
                                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).low.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                            pdVar13 = (double *)infinity();
                            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                            cpp_dec_float<double>(&result_2.m_backend,-*pdVar13,(type *)0x0);
                            tVar5 = boost::multiprecision::operator<=
                                              (pnVar28 + lVar24,
                                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)&result_2.m_backend);
                            if (tVar5) {
LAB_00410598:
                              pdVar13 = (double *)infinity();
                              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              cpp_dec_float<double>(&result_2.m_backend,-*pdVar13,(type *)0x0);
                              (*(lp->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._vptr_ClassArray[0x2a])(lp,lVar24,&result_2.m_backend,0);
                            }
                            else {
                              pnVar28 = (lp->
                                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).up.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                              pdVar13 = (double *)infinity();
                              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              cpp_dec_float<double>(&result_1.m_backend,*pdVar13,(type *)0x0);
                              tVar5 = boost::multiprecision::operator>=
                                                (pnVar28 + lVar19,
                                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)&result_1.m_backend);
                              if (tVar5) goto LAB_00410598;
                              pnVar28 = (lp->
                                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).low.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                              result_1.m_backend.fpclass = cpp_dec_float_finite;
                              result_1.m_backend.prec_elem = 0x1c;
                              result_1.m_backend.data._M_elems[0] = 0;
                              result_1.m_backend.data._M_elems[1] = 0;
                              result_1.m_backend.data._M_elems[2] = 0;
                              result_1.m_backend.data._M_elems[3] = 0;
                              result_1.m_backend.data._M_elems[4] = 0;
                              result_1.m_backend.data._M_elems[5] = 0;
                              result_1.m_backend.data._M_elems[6] = 0;
                              result_1.m_backend.data._M_elems[7] = 0;
                              result_1.m_backend.data._M_elems[8] = 0;
                              result_1.m_backend.data._M_elems[9] = 0;
                              result_1.m_backend.data._M_elems[10] = 0;
                              result_1.m_backend.data._M_elems[0xb] = 0;
                              result_1.m_backend.data._M_elems[0xc] = 0;
                              result_1.m_backend.data._M_elems[0xd] = 0;
                              result_1.m_backend.data._M_elems[0xe] = 0;
                              result_1.m_backend.data._M_elems[0xf] = 0;
                              result_1.m_backend.data._M_elems[0x10] = 0;
                              result_1.m_backend.data._M_elems[0x11] = 0;
                              result_1.m_backend.data._M_elems[0x12] = 0;
                              result_1.m_backend.data._M_elems[0x13] = 0;
                              result_1.m_backend.data._M_elems[0x14] = 0;
                              result_1.m_backend.data._M_elems[0x15] = 0;
                              result_1.m_backend.data._M_elems[0x16] = 0;
                              result_1.m_backend.data._M_elems[0x17] = 0;
                              result_1.m_backend.data._M_elems[0x18] = 0;
                              result_1.m_backend.data._M_elems[0x19] = 0;
                              result_1.m_backend.data._M_elems._104_5_ = 0;
                              result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                              result_1.m_backend.exp = 0;
                              result_1.m_backend.neg = false;
                              boost::multiprecision::default_ops::
                              eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                        (&result_1.m_backend,&factor.m_backend,
                                         &(lp->
                                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).up.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar19].
                                          m_backend);
                              result_2.m_backend.fpclass = cpp_dec_float_finite;
                              result_2.m_backend.prec_elem = 0x1c;
                              result_2.m_backend.data._M_elems[0] = 0;
                              result_2.m_backend.data._M_elems[1] = 0;
                              result_2.m_backend.data._M_elems[2] = 0;
                              result_2.m_backend.data._M_elems[3] = 0;
                              result_2.m_backend.data._M_elems[4] = 0;
                              result_2.m_backend.data._M_elems[5] = 0;
                              result_2.m_backend.data._M_elems[6] = 0;
                              result_2.m_backend.data._M_elems[7] = 0;
                              result_2.m_backend.data._M_elems[8] = 0;
                              result_2.m_backend.data._M_elems[9] = 0;
                              result_2.m_backend.data._M_elems[10] = 0;
                              result_2.m_backend.data._M_elems[0xb] = 0;
                              result_2.m_backend.data._M_elems[0xc] = 0;
                              result_2.m_backend.data._M_elems[0xd] = 0;
                              result_2.m_backend.data._M_elems[0xe] = 0;
                              result_2.m_backend.data._M_elems[0xf] = 0;
                              result_2.m_backend.data._M_elems[0x10] = 0;
                              result_2.m_backend.data._M_elems[0x11] = 0;
                              result_2.m_backend.data._M_elems[0x12] = 0;
                              result_2.m_backend.data._M_elems[0x13] = 0;
                              result_2.m_backend.data._M_elems[0x14] = 0;
                              result_2.m_backend.data._M_elems[0x15] = 0;
                              result_2.m_backend.data._M_elems[0x16] = 0;
                              result_2.m_backend.data._M_elems[0x17] = 0;
                              result_2.m_backend.data._M_elems[0x18] = 0;
                              result_2.m_backend.data._M_elems[0x19] = 0;
                              result_2.m_backend.data._M_elems._104_5_ = 0;
                              result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                              result_2.m_backend.exp = 0;
                              result_2.m_backend.neg = false;
                              boost::multiprecision::default_ops::
                              eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                        (&result_2.m_backend,&pnVar28[lVar24].m_backend,
                                         &result_1.m_backend);
                              (*(lp->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._vptr_ClassArray[0x2a])(lp,lVar24,&result_2,0);
                            }
                            pnVar28 = (lp->
                                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).up.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                            pdVar13 = (double *)infinity();
                            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                            cpp_dec_float<double>(&result_2.m_backend,*pdVar13,(type *)0x0);
                            tVar5 = boost::multiprecision::operator>=
                                              (pnVar28 + lVar24,
                                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)&result_2.m_backend);
                            if (!tVar5) {
                              pnVar28 = (lp->
                                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).low.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                              pdVar13 = (double *)infinity();
                              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              cpp_dec_float<double>(&result_1.m_backend,-*pdVar13,(type *)0x0);
                              tVar5 = boost::multiprecision::operator<=
                                                (pnVar28 + lVar19,
                                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)&result_1.m_backend);
                              if (!tVar5) {
                                pnVar28 = (lp->
                                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).up.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                                result_1.m_backend.fpclass = cpp_dec_float_finite;
                                result_1.m_backend.prec_elem = 0x1c;
                                result_1.m_backend.data._M_elems[0] = 0;
                                result_1.m_backend.data._M_elems[1] = 0;
                                result_1.m_backend.data._M_elems[2] = 0;
                                result_1.m_backend.data._M_elems[3] = 0;
                                result_1.m_backend.data._M_elems[4] = 0;
                                result_1.m_backend.data._M_elems[5] = 0;
                                result_1.m_backend.data._M_elems[6] = 0;
                                result_1.m_backend.data._M_elems[7] = 0;
                                result_1.m_backend.data._M_elems[8] = 0;
                                result_1.m_backend.data._M_elems[9] = 0;
                                result_1.m_backend.data._M_elems[10] = 0;
                                result_1.m_backend.data._M_elems[0xb] = 0;
                                result_1.m_backend.data._M_elems[0xc] = 0;
                                result_1.m_backend.data._M_elems[0xd] = 0;
                                result_1.m_backend.data._M_elems[0xe] = 0;
                                result_1.m_backend.data._M_elems[0xf] = 0;
                                result_1.m_backend.data._M_elems[0x10] = 0;
                                result_1.m_backend.data._M_elems[0x11] = 0;
                                result_1.m_backend.data._M_elems[0x12] = 0;
                                result_1.m_backend.data._M_elems[0x13] = 0;
                                result_1.m_backend.data._M_elems[0x14] = 0;
                                result_1.m_backend.data._M_elems[0x15] = 0;
                                result_1.m_backend.data._M_elems[0x16] = 0;
                                result_1.m_backend.data._M_elems[0x17] = 0;
                                result_1.m_backend.data._M_elems[0x18] = 0;
                                result_1.m_backend.data._M_elems[0x19] = 0;
                                result_1.m_backend.data._M_elems._104_5_ = 0;
                                result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                result_1.m_backend.exp = 0;
                                result_1.m_backend.neg = false;
                                boost::multiprecision::default_ops::
                                eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                          (&result_1.m_backend,&factor.m_backend,
                                           &(lp->
                                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            ).low.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar19].
                                            m_backend);
                                result_2.m_backend.fpclass = cpp_dec_float_finite;
                                result_2.m_backend.prec_elem = 0x1c;
                                result_2.m_backend.data._M_elems[0] = 0;
                                result_2.m_backend.data._M_elems[1] = 0;
                                result_2.m_backend.data._M_elems[2] = 0;
                                result_2.m_backend.data._M_elems[3] = 0;
                                result_2.m_backend.data._M_elems[4] = 0;
                                result_2.m_backend.data._M_elems[5] = 0;
                                result_2.m_backend.data._M_elems[6] = 0;
                                result_2.m_backend.data._M_elems[7] = 0;
                                result_2.m_backend.data._M_elems[8] = 0;
                                result_2.m_backend.data._M_elems[9] = 0;
                                result_2.m_backend.data._M_elems[10] = 0;
                                result_2.m_backend.data._M_elems[0xb] = 0;
                                result_2.m_backend.data._M_elems[0xc] = 0;
                                result_2.m_backend.data._M_elems[0xd] = 0;
                                result_2.m_backend.data._M_elems[0xe] = 0;
                                result_2.m_backend.data._M_elems[0xf] = 0;
                                result_2.m_backend.data._M_elems[0x10] = 0;
                                result_2.m_backend.data._M_elems[0x11] = 0;
                                result_2.m_backend.data._M_elems[0x12] = 0;
                                result_2.m_backend.data._M_elems[0x13] = 0;
                                result_2.m_backend.data._M_elems[0x14] = 0;
                                result_2.m_backend.data._M_elems[0x15] = 0;
                                result_2.m_backend.data._M_elems[0x16] = 0;
                                result_2.m_backend.data._M_elems[0x17] = 0;
                                result_2.m_backend.data._M_elems[0x18] = 0;
                                result_2.m_backend.data._M_elems[0x19] = 0;
                                result_2.m_backend.data._M_elems._104_5_ = 0;
                                result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                                result_2.m_backend.exp = 0;
                                result_2.m_backend.neg = false;
                                boost::multiprecision::default_ops::
                                eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                          (&result_2.m_backend,&pnVar28[lVar24].m_backend,
                                           &result_1.m_backend);
                                (*(lp->
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).
                                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .
                                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._vptr_ClassArray[0x2d])(lp,lVar24,&result_2,0);
                                goto LAB_00410afb;
                              }
                            }
                            pdVar13 = (double *)infinity();
                            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                            cpp_dec_float<double>(&result_2.m_backend,*pdVar13,(type *)0x0);
                            (*(lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._vptr_ClassArray[0x2d])(lp,lVar24,&result_2.m_backend,0);
                          }
                        }
LAB_00410afb:
                        remCol.data[lVar19] = true;
                        piVar3 = (this->m_stat).data + 0xe;
                        *piVar3 = *piVar3 + 1;
                        this_01 = &ptr_1.
                                   super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount;
                      }
                      else {
LAB_004104da:
                        this_01 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                  (result_2.m_backend.data._M_elems + 2);
                      }
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_01);
                    }
                    else {
                      pdVar13 = (double *)infinity();
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                      cpp_dec_float<double>(&result_2.m_backend,-*pdVar13,(type *)0x0);
                      tVar5 = boost::multiprecision::operator<=
                                        (pnVar28 + lVar24,
                                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&result_2.m_backend);
                      if (tVar5) {
                        result_2.m_backend.data._M_elems._0_8_ =
                             result_2.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
                        tVar5 = boost::multiprecision::operator>(&factor,(int *)&result_2);
                        if (tVar5) {
                          result_1.m_backend.data._M_elems._0_8_ =
                               result_1.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
                          tVar5 = boost::multiprecision::operator>
                                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)&perm,(int *)&result_1);
                          if (!tVar5) goto LAB_0041012d;
                          pnVar28 = (lp->
                                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).up.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pdVar13 = (double *)infinity();
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          cpp_dec_float<double>(&result_2.m_backend,*pdVar13,(type *)0x0);
                          tVar5 = boost::multiprecision::operator>=
                                            (pnVar28 + lVar19,
                                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)&result_2.m_backend);
                          if (tVar5) {
LAB_00410b41:
                            if (lVar36 <= lVar23) goto LAB_00410b6a;
                            RVar8 = UNBOUNDED;
                            goto LAB_00410ed4;
                          }
                          pnVar28 = (lp->
                                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).up.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pFVar14 = (FixBoundsPS *)operator_new(0x30);
                          pnVar30 = pnVar28 + lVar19;
                          pnVar31 = &local_9b0;
                          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                            (pnVar31->m_backend).data._M_elems[0] =
                                 (pnVar30->m_backend).data._M_elems[0];
                            pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
                            pnVar31 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)((long)pnVar31 + ((ulong)bVar38 * -2 + 1) * 4);
                          }
                          local_9b0.m_backend.exp = pnVar28[lVar19].m_backend.exp;
                          local_9b0.m_backend.neg = pnVar28[lVar19].m_backend.neg;
                          local_9b0.m_backend.fpclass = pnVar28[lVar19].m_backend.fpclass;
                          local_9b0.m_backend.prec_elem = pnVar28[lVar19].m_backend.prec_elem;
                          std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                          __shared_ptr(&local_d18,
                                       &psVar10->
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      );
                          FixBoundsPS::FixBoundsPS
                                    (pFVar14,lp,iVar25,&local_9b0,
                                     (shared_ptr<soplex::Tolerances> *)&local_d18);
                          std::
                          __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                          ::
                          __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                                    ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                                      *)&result_2,pFVar14);
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    (&local_d18._M_refcount);
                          std::
                          vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                          ::push_back(&this_00->data,(value_type *)&result_2);
                          (*(lp->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .
                            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._vptr_ClassArray[0x2a])
                                    (lp,lVar19,
                                     (lp->
                                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).up.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar19,0);
LAB_004103d1:
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                     (result_2.m_backend.data._M_elems + 2));
                        }
                        else {
LAB_0041012d:
                          result_2.m_backend.data._M_elems._0_8_ =
                               result_2.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
                          tVar5 = boost::multiprecision::operator<(&factor,(int *)&result_2);
                          if (tVar5) {
                            result_1.m_backend.data._M_elems._0_8_ =
                                 result_1.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
                            tVar5 = boost::multiprecision::operator<
                                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)&perm,(int *)&result_1);
                            if (tVar5) {
                              pnVar28 = (lp->
                                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).low.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                              pdVar13 = (double *)infinity();
                              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              cpp_dec_float<double>(&result_2.m_backend,-*pdVar13,(type *)0x0);
                              tVar5 = boost::multiprecision::operator<=
                                                (pnVar28 + lVar19,
                                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)&result_2.m_backend);
                              if (tVar5) goto LAB_00410b41;
                              pnVar28 = (lp->
                                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).low.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                              pFVar14 = (FixBoundsPS *)operator_new(0x30);
                              pnVar30 = pnVar28 + lVar19;
                              pnVar31 = &local_a30;
                              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                                (pnVar31->m_backend).data._M_elems[0] =
                                     (pnVar30->m_backend).data._M_elems[0];
                                pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
                                pnVar31 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)((long)pnVar31 + ((ulong)bVar38 * -2 + 1) * 4);
                              }
                              local_a30.m_backend.exp = pnVar28[lVar19].m_backend.exp;
                              local_a30.m_backend.neg = pnVar28[lVar19].m_backend.neg;
                              local_a30.m_backend.fpclass = pnVar28[lVar19].m_backend.fpclass;
                              local_a30.m_backend.prec_elem = pnVar28[lVar19].m_backend.prec_elem;
                              std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                              __shared_ptr(&local_d28,
                                           &psVar10->
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          );
                              FixBoundsPS::FixBoundsPS
                                        (pFVar14,lp,iVar25,&local_a30,
                                         (shared_ptr<soplex::Tolerances> *)&local_d28);
                              std::
                              __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                              ::
                              __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                                        ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                                          *)&result_2,pFVar14);
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        (&local_d28._M_refcount);
                              std::
                              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                              ::push_back(&this_00->data,(value_type *)&result_2);
                              (*(lp->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._vptr_ClassArray[0x2d])
                                        (lp,lVar19,
                                         (lp->
                                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).low.val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar19,0);
                              goto LAB_004103d1;
                            }
                          }
                        }
                      }
                      else {
                        pnVar28 = (lp->
                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).up.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        pdVar13 = (double *)infinity();
                        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                        cpp_dec_float<double>(&result_2.m_backend,*pdVar13,(type *)0x0);
                        tVar5 = boost::multiprecision::operator>=
                                          (pnVar28 + lVar24,
                                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&result_2.m_backend);
                        if (tVar5) {
                          result_2.m_backend.data._M_elems._0_8_ =
                               result_2.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
                          tVar5 = boost::multiprecision::operator<(&factor,(int *)&result_2);
                          if (tVar5) {
                            result_1.m_backend.data._M_elems._0_8_ =
                                 result_1.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
                            tVar5 = boost::multiprecision::operator>
                                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)&perm,(int *)&result_1);
                            if (tVar5) {
                              pnVar28 = (lp->
                                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).up.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                              pdVar13 = (double *)infinity();
                              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              cpp_dec_float<double>(&result_2.m_backend,*pdVar13,(type *)0x0);
                              tVar5 = boost::multiprecision::operator>=
                                                (pnVar28 + lVar19,
                                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)&result_2.m_backend);
                              if (tVar5) goto LAB_00410b41;
                              pnVar28 = (lp->
                                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).up.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                              pFVar14 = (FixBoundsPS *)operator_new(0x30);
                              pnVar30 = pnVar28 + lVar19;
                              pnVar31 = &local_ab0;
                              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                                (pnVar31->m_backend).data._M_elems[0] =
                                     (pnVar30->m_backend).data._M_elems[0];
                                pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
                                pnVar31 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)((long)pnVar31 + ((ulong)bVar38 * -2 + 1) * 4);
                              }
                              local_ab0.m_backend.exp = pnVar28[lVar19].m_backend.exp;
                              local_ab0.m_backend.neg = pnVar28[lVar19].m_backend.neg;
                              local_ab0.m_backend.fpclass = pnVar28[lVar19].m_backend.fpclass;
                              local_ab0.m_backend.prec_elem = pnVar28[lVar19].m_backend.prec_elem;
                              std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                              __shared_ptr(&local_d38,
                                           &psVar10->
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          );
                              FixBoundsPS::FixBoundsPS
                                        (pFVar14,lp,iVar25,&local_ab0,
                                         (shared_ptr<soplex::Tolerances> *)&local_d38);
                              std::
                              __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                              ::
                              __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                                        ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                                          *)&result_2,pFVar14);
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        (&local_d38._M_refcount);
                              std::
                              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                              ::push_back(&this_00->data,(value_type *)&result_2);
                              (*(lp->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._vptr_ClassArray[0x2a])
                                        (lp,lVar19,
                                         (lp->
                                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).up.val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar19,0);
                              goto LAB_004103d1;
                            }
                          }
                          result_2.m_backend.data._M_elems._0_8_ =
                               result_2.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
                          tVar5 = boost::multiprecision::operator>(&factor,(int *)&result_2);
                          if (tVar5) {
                            result_1.m_backend.data._M_elems._0_8_ =
                                 result_1.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
                            tVar5 = boost::multiprecision::operator<
                                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)&perm,(int *)&result_1);
                            if (tVar5) {
                              pnVar28 = (lp->
                                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).low.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                              pdVar13 = (double *)infinity();
                              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              cpp_dec_float<double>(&result_2.m_backend,-*pdVar13,(type *)0x0);
                              tVar5 = boost::multiprecision::operator<=
                                                (pnVar28 + lVar19,
                                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)&result_2.m_backend);
                              if (tVar5) goto LAB_00410b41;
                              pnVar28 = (lp->
                                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).low.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                              pFVar14 = (FixBoundsPS *)operator_new(0x30);
                              pnVar30 = pnVar28 + lVar19;
                              pnVar31 = &local_b30;
                              for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                                (pnVar31->m_backend).data._M_elems[0] =
                                     (pnVar30->m_backend).data._M_elems[0];
                                pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
                                pnVar31 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)((long)pnVar31 + ((ulong)bVar38 * -2 + 1) * 4);
                              }
                              local_b30.m_backend.exp = pnVar28[lVar19].m_backend.exp;
                              local_b30.m_backend.neg = pnVar28[lVar19].m_backend.neg;
                              local_b30.m_backend.fpclass = pnVar28[lVar19].m_backend.fpclass;
                              local_b30.m_backend.prec_elem = pnVar28[lVar19].m_backend.prec_elem;
                              std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::
                              __shared_ptr(&local_d48,
                                           &psVar10->
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          );
                              FixBoundsPS::FixBoundsPS
                                        (pFVar14,lp,iVar25,&local_b30,
                                         (shared_ptr<soplex::Tolerances> *)&local_d48);
                              std::
                              __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                              ::
                              __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                                        ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                                          *)&result_2,pFVar14);
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        (&local_d48._M_refcount);
                              std::
                              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                              ::push_back(&this_00->data,(value_type *)&result_2);
                              (*(lp->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._vptr_ClassArray[0x2d])
                                        (lp,lVar19,
                                         (lp->
                                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).low.val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar19,0);
                              goto LAB_004103d1;
                            }
                          }
                        }
                      }
                      pnVar28 = (lp->
                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).low.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      lVar24 = 0x1c;
                      pnVar30 = pnVar28 + lVar19;
                      pnVar31 = &local_bb0;
                      for (lVar21 = lVar24; lVar21 != 0; lVar21 = lVar21 + -1) {
                        (pnVar31->m_backend).data._M_elems[0] =
                             (pnVar30->m_backend).data._M_elems[0];
                        pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
                        pnVar31 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)((long)pnVar31 + ((ulong)bVar38 * -2 + 1) * 4);
                      }
                      local_bb0.m_backend.exp = pnVar28[lVar19].m_backend.exp;
                      local_bb0.m_backend.neg = pnVar28[lVar19].m_backend.neg;
                      local_bb0.m_backend.fpclass = pnVar28[lVar19].m_backend.fpclass;
                      local_bb0.m_backend.prec_elem = pnVar28[lVar19].m_backend.prec_elem;
                      pnVar28 = (lp->
                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).up.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      pnVar30 = pnVar28 + lVar19;
                      pnVar31 = &local_c30;
                      for (; lVar24 != 0; lVar24 = lVar24 + -1) {
                        (pnVar31->m_backend).data._M_elems[0] =
                             (pnVar30->m_backend).data._M_elems[0];
                        pnVar30 = (pointer)((long)pnVar30 + ((ulong)bVar38 * -2 + 1) * 4);
                        pnVar31 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)((long)pnVar31 + ((ulong)bVar38 * -2 + 1) * 4);
                      }
                      local_c30.m_backend.exp = pnVar28[lVar19].m_backend.exp;
                      local_c30.m_backend.neg = pnVar28[lVar19].m_backend.neg;
                      local_c30.m_backend.fpclass = pnVar28[lVar19].m_backend.fpclass;
                      local_c30.m_backend.prec_elem = pnVar28[lVar19].m_backend.prec_elem;
                      feastol(&local_4b0,this);
                      bVar7 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (&local_bb0,&local_c30,&local_4b0);
                      if (bVar7) {
                        remCol.data[lVar19] = true;
                        fixAndRemCol.data[lVar19] = true;
                        piVar3 = (this->m_stat).data + 0xd;
                        *piVar3 = *piVar3 + 1;
                      }
                    }
LAB_004104e4:
                    pDVar15 = (this->m_dupCols).data.
                              super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  }
                }
              }
              lVar18 = lVar18 + 0x84;
            }
            local_1190 = local_1190 + 0x84;
          }
        }
      }
LAB_00410b6a:
      lVar23 = 0;
      while( true ) {
        uVar9 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum;
        if ((int)uVar9 <= lVar23) break;
        if (fixAndRemCol.data[lVar23] == true) {
          fixColumn(this,lp,(int)lVar23,false);
        }
        lVar23 = lVar23 + 1;
      }
      perm = (int *)0x0;
      spx_alloc<int*>(&perm,uVar9);
      pIVar34 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem;
      pDVar2 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey;
      uVar11 = 0;
      uVar37 = 0;
      if (0 < (int)uVar9) {
        uVar37 = (ulong)uVar9;
      }
      iVar25 = 0;
      for (; uVar37 != uVar11; uVar11 = uVar11 + 1) {
        if (remCol.data[uVar11] == true) {
          perm[uVar11] = -1;
          remCols = remCols + 1;
          iVar25 = iVar25 + pIVar34[pDVar2[uVar11].idx].data.
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .memused;
        }
        else {
          perm[uVar11] = 0;
        }
      }
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x17])(lp,perm);
      piVar3 = (this->m_cIdx).data;
      for (uVar11 = 0; uVar37 != uVar11; uVar11 = uVar11 + 1) {
        if (-1 < (long)perm[uVar11]) {
          piVar3[perm[uVar11]] = piVar3[uVar11];
        }
      }
      DataArray<int>::DataArray(&da_perm,uVar9,0,1.2);
      for (uVar11 = 0; uVar37 != uVar11; uVar11 = uVar11 + 1) {
        da_perm.data[uVar11] = perm[uVar11];
      }
      if (bVar6) {
        pDVar12 = (DuplicateColsPS *)operator_new(0x2d0);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&local_530,1.0,(type *)0x0);
        DataArray<int>::DataArray(&local_cf8,&da_perm);
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_d58,
                   &psVar10->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        DuplicateColsPS::DuplicateColsPS
                  (pDVar12,lp,0,0,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_530,&local_cf8,(shared_ptr<soplex::Tolerances> *)&local_d58,false,true)
        ;
        std::
        __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
        ::
        __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS,void>
                  ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                    *)&compare,pDVar12);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d58._M_refcount);
        DataArray<int>::~DataArray(&local_cf8);
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
        ::push_back(&this_00->data,(value_type *)&compare);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (compare.epsiloncompare.m_backend.data._M_elems + 2));
      }
      free(perm);
      iVar35 = remCols;
      perm = (int *)0x0;
      if (0 < remCols) {
        piVar3 = &(this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_remCols;
        *piVar3 = *piVar3 + remCols;
        piVar3 = &(this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_remNzos;
        *piVar3 = *piVar3 + iVar25;
        pSVar16 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        if ((pSVar16 != (SPxOut *)0x0) && (3 < (int)pSVar16->m_verbosity)) {
          compare.epsiloncompare.m_backend.data._M_elems[0] = pSVar16->m_verbosity;
          factor.m_backend.data._M_elems[0] = 4;
          (*pSVar16->_vptr_SPxOut[2])();
          pSVar16 = soplex::operator<<((this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).spxout,"Simplifier (duplicate columns) removed ");
          pSVar16 = soplex::operator<<(pSVar16,iVar35);
          pSVar16 = soplex::operator<<(pSVar16," cols, ");
          pSVar16 = soplex::operator<<(pSVar16,iVar25);
          pSVar16 = soplex::operator<<(pSVar16," non-zeros");
          std::endl<char,std::char_traits<char>>(pSVar16->m_streams[pSVar16->m_verbosity]);
          pSVar16 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          (*pSVar16->_vptr_SPxOut[2])(pSVar16,&compare);
        }
        compare.epsiloncompare.m_backend.fpclass = cpp_dec_float_finite;
        compare.epsiloncompare.m_backend.prec_elem = 0x1c;
        compare.epsiloncompare.m_backend.data._M_elems[0] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[1] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[2] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[3] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[4] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[5] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[6] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[7] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[8] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[9] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[10] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0xb] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0xc] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0xd] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0xe] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0xf] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0x18] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0x19] = 0;
        compare.epsiloncompare.m_backend.data._M_elems._104_5_ = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        compare.epsiloncompare.m_backend.exp = 0;
        compare.epsiloncompare.m_backend.neg = false;
        compare.epsiloncompare.m_backend.data._M_elems[0x10] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0x11] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0x12] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0x13] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0x14] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0x15] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0x16] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0x17] = 0;
        factor.m_backend.data._M_elems._0_8_ = (long)(int)uVar9;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                  ((cpp_dec_float<200U,_int,_void> *)&compare,
                   &(this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).m_minReduction.m_backend,(longlong *)&factor);
        tVar5 = boost::multiprecision::operator>(&remCols,&compare.epsiloncompare);
        if (tVar5) {
          *again = true;
        }
      }
      DataArray<int>::~DataArray(&da_perm);
      RVar8 = OKAY;
LAB_00410ed4:
      DataArray<int>::~DataArray(&m_perm_empty);
      DataArray<bool>::~DataArray(&fixAndRemCol);
      DataArray<bool>::~DataArray(&remCol);
      IdxSet::~IdxSet(&idxSet);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)&scale);
      DataArray<int>::~DataArray(&classSize);
      DataArray<int>::~DataArray(&pClass);
    }
  }
  return RVar8;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateCols(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate columns
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   int remCols = 0;
   int remNzos = 0;

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

   if(lp.nCols() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nCols());          // class of parallel columns
   DataArray<int>    classSize(lp.nCols());       // size of each class
   Array<R>   scale(lp.nCols());           // scaling factor for each column
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nCols());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nCols(), idxMem);  // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nCols();

   for(int j = 1; j < lp.nCols(); ++j)
   {
      pClass[j] = 0;
      scale[j]  = 0.0;
      classSize[j] = 0;
      idxSet.addIdx(j);
   }

   R oldVal = 0.0;

   // main loop
   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      for(int k = 0; k < row.size(); ++k)
      {
         R aij = row.value(k);
         int  j   = row.index(k);

         if(scale[j] == 0.0)
            scale[j] = aij;

         m_classSetCols[pClass[j]].add(j, aij / scale[j]);

         if(--classSize[pClass[j]] == 0)
            idxSet.addIdx(pClass[j]);
      }

      // update each parallel class with non-zero row entry
      for(int m = 0; m < row.size(); ++m)
      {
         int k = pClass[row.index(m)];

         if(m_classSetCols[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled row values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetCols[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetCols[k].hasNaNs());
               assert(!m_classSetCols[k].hasInfs());
               SPxQuicksort(m_classSetCols[k].mem(), m_classSetCols[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetCols[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetCols[k].value(l), oldVal, this->epsZero()))
               {
                  // start new parallel class
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetCols[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetCols[k].value(l);
            }

            m_classSetCols[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remCol(lp.nCols());
   DataArray<bool> fixAndRemCol(lp.nCols());

   for(int k = 0; k < lp.nCols(); ++k)
      m_dupCols[k].clear();

   for(int k = 0; k < lp.nCols(); ++k)
   {
      remCol[k] = false;
      fixAndRemCol[k] = false;
      m_dupCols[pClass[k]].add(k, 0.0);
   }

   bool hasDuplicateCol = false;
   DataArray<int>  m_perm_empty(0);

   for(int k = 0; k < lp.nCols(); ++k)
   {
      if(m_dupCols[k].size() > 1 && !(lp.colVector(m_dupCols[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM58 {} duplicate columns found\n", m_dupCols[k].size());

         if(!hasDuplicateCol)
         {
            std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, m_perm_empty, this->_tolerances,
                                          true));
            m_hist.append(ptr);
            hasDuplicateCol = true;
         }

         for(int l = 0; l < m_dupCols[k].size(); ++l)
         {
            for(int m = 0; m < m_dupCols[k].size(); ++m)
            {
               int j1  = m_dupCols[k].index(l);
               int j2  = m_dupCols[k].index(m);

               if(l != m && !remCol[j1] && !remCol[j2])
               {
                  R cj1 = lp.maxObj(j1);
                  R cj2 = lp.maxObj(j2);

                  // A.j1 = factor * A.j2
                  R factor = scale[j1] / scale[j2];
                  R objDif = cj1 - cj2 * scale[j1] / scale[j2];

                  SOPLEX_ASSERT_WARN("WMAISM59", isNotZero(factor, this->epsZero()));

                  if(isZero(objDif, this->epsZero()))
                  {
                     // case 1: objectives also duplicate

                     // if 0 is not within the column bounds, we are not able to postsolve if the aggregated column has
                     // status ZERO, hence we skip this case
                     if(LErel(lp.lower(j1), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j1), R(0.0), this->tolerances()->epsilon())
                           && LErel(lp.lower(j2), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j2), R(0.0), this->tolerances()->epsilon()))
                     {
                        std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, j1, j2, factor, m_perm_empty,
                                                      this->_tolerances));
                        // variable substitution xj2' := xj2 + factor * xj1 <=> xj2 = -factor * xj1 + xj2'
                        m_hist.append(ptr);

                        // update bounds of remaining column j2 (new column j2')
                        if(factor > 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.lower(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.upper(j1));
                        }
                        else if(factor < 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.upper(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.lower(j1));
                        }

                        SPxOut::debug(this, "IMAISM60 two duplicate columns {}, {} replaced by one\n", j1, j2);

                        remCol[j1] = true;

                        ++m_stat[SUB_DUPLICATE_COL];
                     }
                     else
                     {
                        SPxOut::debug(this,
                                      "IMAISM80 not removing two duplicate columns {}, {} because zero not contained in their bounds\n",
                                      j1, j2);
                     }
                  }
                  else
                  {
                     // case 2: objectives not duplicate
                     // considered for maximization sense
                     if(lp.lower(j2) <= R(-infinity))
                     {
                        if(factor > 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM75 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM61 two duplicate columns {}, {} first one fixed at upper bound={}\n", j1,
                                         j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }
                        else if(factor < 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM76 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM62 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }
                     else if(lp.upper(j2) >= R(infinity))
                     {
                        // fix j1 at upper bound
                        if(factor < 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM77 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM63 two duplicate columns {}, {},  first one fixed at upper bound={}\n",
                                         j1, j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }

                        // fix j1 at lower bound
                        else if(factor > 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM78 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM64 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }

                     if(EQrel(lp.lower(j1), lp.upper(j1), feastol()))
                     {
                        remCol[j1] = true;
                        fixAndRemCol[j1] = true;

                        ++m_stat[FIX_DUPLICATE_COL];
                     }
                  }
               }
            }
         }
      }
   }

   for(int j = 0; j < lp.nCols(); ++j)
   {
      if(fixAndRemCol[j])
      {
         assert(remCol[j]);

         // correctIdx == false, because the index mapping will be handled by the postsolving in DuplicateColsPS
         fixColumn(lp, j, false);
      }
   }

   // remove all columns by one single method call (more efficient)
   const int nColsOld = lp.nCols();
   int* perm = nullptr;
   spx_alloc(perm, nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(remCol[j])
      {
         perm[j] = -1;
         ++remCols;
         remNzos += lp.colVector(j).size();
      }
      else
         perm[j] = 0;
   }

   lp.removeCols(perm);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(perm[j] >= 0)
         m_cIdx[perm[j]] = m_cIdx[j];
   }

   DataArray<int> da_perm(nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      da_perm[j] = perm[j];
   }

   if(hasDuplicateCol)
   {
      std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, da_perm, this->_tolerances, false,
                                    true));
      m_hist.append(ptr);
   }

   spx_free(perm);

   assert(remCols > 0 || remNzos == 0);

   if(remCols > 0)
   {
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate columns) removed "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols > this->m_minReduction * nColsOld)
         again = true;
   }

   return this->OKAY;
}